

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall VarTable::print(VarTable *this)

{
  Symbol *pSVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  Symbol **ppSVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n**********************************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t\t");
  poVar2 = std::operator<<(poVar2,"VARS");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "**********************************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Lexeme");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Scope");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Scope Lexeme");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Type");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Size");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "**********************************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar4 = 0; lVar4 != 0x65; lVar4 = lVar4 + 1) {
    ppSVar5 = (this->super_SymbolTable).block + lVar4;
    while (pSVar1 = *ppSVar5, pSVar1 != (Symbol *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               (this->super_SymbolTable).lexemeArray + pSVar1->lexemeIndex);
      poVar2 = std::operator<<(poVar2,"\t\t");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pSVar1->scope);
      poVar2 = std::operator<<(poVar2,"\t\t");
      poVar2 = std::operator<<(poVar2,pSVar1->lexemeScope);
      poVar2 = std::operator<<(poVar2,"\t\t");
      pcVar3 = token_id_to_name(*(int *)(pSVar1[1]._vptr_Symbol[2] + 0x38));
      std::operator<<(poVar2,pcVar3);
      if (*(int *)(pSVar1[1]._vptr_Symbol[2] + 0x38) == 10) {
        poVar2 = std::operator<<((ostream *)&std::cout," ");
        std::operator<<(poVar2,*(char **)(pSVar1[1]._vptr_Symbol[2] + 0x30));
      }
      if ((char)pSVar1[1].lexemeIndex == '\x01') {
        std::operator<<((ostream *)&std::cout," POINTER");
      }
      if (-1 < *(int *)&pSVar1[1].field_0xc) {
        std::operator<<((ostream *)&std::cout," ARRAY");
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"\t\t");
      std::ostream::operator<<(poVar2,*(int *)((long)&pSVar1[1].lexemeScope + 4));
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      ppSVar5 = &pSVar1->nextSymbol;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "**********************************************************");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "####################################################################################################################"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void VarTable::print() {
    cout << "\n**********************************************************" << endl;
    cout << "\t\t" << "VARS" << endl;
    cout << "**********************************************************" << endl;
    cout << "Lexeme" << "\t" << "Scope" << "\t" << "Scope Lexeme" << "\t" << "Type" <<  "\t" << "Size" << endl;
    cout << "**********************************************************" << endl;
    for (int i = 0; i < TABLE_SIZE; i++) {
        for (VarSymbol *symbol = (VarSymbol *) block[i];
             symbol != NULL; symbol = (VarSymbol *) symbol->getNextSymbol()) {
            cout << lexemeArray + symbol->getLexemeIndex() << "\t\t" << symbol->getScope() << "\t\t"
                 << symbol->getLexemeScope() << "\t\t"
                 << token_id_to_name(symbol->getType()->getType()/*symbol->getType()->getId()->getToken()*/);

            if (symbol->getType()->getType() == ID)
                cout << " " << symbol->getType()->getTypeLexeme();

            if (symbol->isPointer())
                cout << " POINTER";

            if (symbol->getArraySize() >= 0)
                cout << " ARRAY";

            cout << "\t\t" << symbol->getSize();
            cout << endl;
        }
    }
    cout << "**********************************************************" << endl;
    cout
            << "####################################################################################################################"
            << endl;
}